

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::Prog(Prog *this)

{
  Prog *this_local;
  
  this->anchor_start_ = false;
  this->anchor_end_ = false;
  this->reversed_ = false;
  this->did_flatten_ = false;
  this->did_onepass_ = false;
  this->start_ = 0;
  this->start_unanchored_ = 0;
  this->size_ = 0;
  this->bytemap_range_ = 0;
  this->first_byte_ = -1;
  this->flags_ = 0;
  this->onepass_statesize_ = 0;
  this->inst_ = (Inst *)0x0;
  Mutex::Mutex(&this->dfa_mutex_);
  std::atomic<re2::DFA_*>::atomic(&this->dfa_first_,(__pointer_type)0x0);
  std::atomic<re2::DFA_*>::atomic(&this->dfa_longest_,(__pointer_type)0x0);
  this->dfa_mem_ = 0;
  this->onepass_nodes_ = (uint8 *)0x0;
  this->onepass_start_ = (OneState *)0x0;
  std::once_flag::once_flag(&this->first_byte_once_);
  return;
}

Assistant:

Prog::Prog()
  : anchor_start_(false),
    anchor_end_(false),
    reversed_(false),
    did_flatten_(false),
    did_onepass_(false),
    start_(0),
    start_unanchored_(0),
    size_(0),
    bytemap_range_(0),
    first_byte_(-1),
    flags_(0),
    onepass_statesize_(0),
    inst_(NULL),
    dfa_first_(NULL),
    dfa_longest_(NULL),
    dfa_mem_(0),
    onepass_nodes_(NULL),
    onepass_start_(NULL) {
}